

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,ImGuiSliderFlags flags)

{
  long lVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ImGuiKey IVar9;
  ImGuiAxis axis;
  long lVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  pIVar2 = GImGui;
  bVar11 = v_max - v_min != 0;
  if (v_speed == 0.0 && (bVar11 && v_min <= v_max)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  axis = (flags & 0x100000U) >> 0x14;
  uVar7 = data_type & 0xfffffffe;
  if (((GImGui->ActiveIdSource == ImGuiInputSource_Mouse) &&
      (bVar3 = IsMousePosValid((ImVec2 *)0x0), bVar3)) &&
     (bVar3 = IsMouseDragPastThreshold(0,(pIVar2->IO).MouseDragThreshold * 0.5), bVar3)) {
    fVar14 = *(float *)((pIVar2->IO).MouseDown + (ulong)(uint)axis * 4 + -0x18);
    if ((pIVar2->IO).KeyAlt != false) {
      fVar14 = fVar14 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar14 = fVar14 * 10.0;
    }
  }
  else {
    fVar14 = 0.0;
    if ((pIVar2->ActiveIdSource & ~ImGuiInputSource_Mouse) == ImGuiInputSource_Keyboard) {
      uVar8 = 0;
      if (uVar7 == 8) {
        uVar8 = ImParseFormatPrecision(format,3);
      }
      IVar9 = ImGuiKey_ModCtrl;
      if (pIVar2->NavInputSource == ImGuiInputSource_Gamepad) {
        IVar9 = ImGuiKey_GamepadL1;
      }
      bVar3 = IsKeyDown(IVar9);
      IVar9 = ImGuiKey_ModShift;
      if (pIVar2->NavInputSource == ImGuiInputSource_Gamepad) {
        IVar9 = ImGuiKey_GamepadR1;
      }
      bVar4 = IsKeyDown(IVar9);
      if (bVar4) {
        fVar13 = 10.0;
      }
      else {
        fVar13 = 1.0;
      }
      if (bVar3) {
        fVar13 = 0.1;
      }
      fVar14 = GetNavTweakPressedAmount(axis);
      if ((int)uVar8 < 0) {
        fVar12 = 1.1754944e-38;
      }
      else if ((int)uVar8 < 10) {
        fVar12 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar8 * 4);
      }
      else {
        fVar12 = powf(10.0,(float)(int)-uVar8);
      }
      fVar14 = fVar14 * fVar13;
      v_speed = (float)((uint)v_speed & -(uint)(fVar12 <= v_speed) |
                       ~-(uint)(fVar12 <= v_speed) & (uint)fVar12);
    }
  }
  fVar14 = fVar14 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar14 = -fVar14;
  }
  if (((flags & 0x20U) != 0) && (v_max - v_min != 0 && v_min <= v_max)) {
    fVar14 = fVar14 / (float)(v_max - v_min);
  }
  if ((bVar11 && v_min <= v_max) && (flags & 0x100U) == 0) {
    if ((*v < v_max) || (bVar3 = true, fVar14 <= 0.0)) {
      bVar3 = fVar14 < 0.0 && *v <= v_min;
    }
  }
  else {
    bVar3 = false;
  }
  if ((pIVar2->ActiveIdIsJustActivated != false) || (bVar3)) {
    pIVar2->DragCurrentAccum = 0.0;
    bVar3 = false;
  }
  else {
    if ((fVar14 == 0.0) && (!NAN(fVar14))) goto LAB_001d4dac;
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar14;
    bVar3 = true;
  }
  pIVar2->DragCurrentAccumDirty = bVar3;
LAB_001d4dac:
  if (pIVar2->DragCurrentAccumDirty == true) {
    lVar10 = *v;
    if ((flags & 0x20U) == 0) {
      lVar10 = lVar10 + (long)pIVar2->DragCurrentAccum;
      fVar12 = 0.0;
      fVar13 = 0.0;
    }
    else {
      if (uVar7 == 8) {
        iVar5 = ImParseFormatPrecision(format,3);
        fVar13 = (float)iVar5;
      }
      else {
        fVar13 = 1.0;
      }
      fVar12 = powf(0.1,fVar13);
      fVar13 = ScaleRatioFromValueT<long_long,long_long,double>
                         (data_type,lVar10,v_min,v_max,true,fVar12,0.0);
      lVar10 = ScaleValueFromRatioT<long_long,long_long,double>
                         (data_type,pIVar2->DragCurrentAccum + fVar13,v_min,v_max,true,fVar12,0.0);
    }
    if ((flags & 0x40U) == 0 && uVar7 == 8) {
      lVar10 = RoundScalarWithFormatT<long_long>(format,data_type,lVar10);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if ((flags & 0x20U) == 0) {
      fVar12 = (float)(lVar10 - *v);
    }
    else {
      fVar12 = ScaleRatioFromValueT<long_long,long_long,double>
                         (data_type,lVar10,v_min,v_max,true,fVar12,0.0);
      fVar12 = fVar12 - fVar13;
    }
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - fVar12;
    lVar1 = *v;
    if ((v_min < v_max) && (lVar1 != lVar10)) {
      if (((bVar11 && v_min <= v_max) & (byte)((uint)flags >> 8) & 1) == 0) {
        if ((lVar10 < v_min) || (((uVar7 != 8 && (lVar1 < lVar10)) && (fVar14 < 0.0)))) {
          lVar10 = v_min;
        }
        if ((v_max < lVar10) || (((uVar7 != 8 && (lVar10 < lVar1)) && (0.0 < fVar14)))) {
          lVar10 = v_max;
        }
      }
      else {
        lVar6 = 0;
        if (lVar10 < v_min) {
          lVar6 = ((ulong)(uVar7 != 8) - v_min) + v_max;
        }
        lVar10 = lVar10 + lVar6;
        if (v_max < lVar10) {
          lVar10 = lVar10 + ((v_min - (ulong)(uVar7 != 8)) - v_max);
        }
      }
    }
    bVar11 = lVar1 != lVar10;
    if (bVar11) {
      *v = lVar10;
      bVar11 = true;
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_bounded = (v_min < v_max);
    const bool is_wrapped = is_bounded && (flags & ImGuiSliderFlags_WrapAround);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    // Default tweak speed
    if (v_speed == 0.0f && is_bounded && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && IsMouseDragPastThreshold(0, g.IO.MouseDragThreshold * DRAG_MOUSE_THRESHOLD_FACTOR))
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Keyboard || g.ActiveIdSource == ImGuiInputSource_Gamepad)
    {
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
        const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
        const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
        const float tweak_factor = tweak_slow ? 1.0f / 10.0f : tweak_fast ? 10.0f : 1.0f;
        adjust_delta = GetNavTweakPressedAmount(axis) * tweak_factor;
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    const bool is_just_activated = g.ActiveIdIsJustActivated;
    const bool is_already_past_limits_and_pushing_outward = is_bounded && !is_wrapped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    if (*v != v_cur && is_bounded)
    {
        if (is_wrapped)
        {
            // Wrap values
            if (v_cur < v_min)
                v_cur += v_max - v_min + (is_floating_point ? 0 : 1);
            if (v_cur > v_max)
                v_cur -= v_max - v_min + (is_floating_point ? 0 : 1);
        }
        else
        {
            // Clamp values + handle overflow/wrap-around for integer types.
            if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_floating_point))
                v_cur = v_min;
            if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_floating_point))
                v_cur = v_max;
        }
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}